

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

size_t PAL_wcscspn(char16_t *string,char16_t *strCharSet)

{
  char16_t cVar1;
  size_t count;
  size_t sVar2;
  char16_t *pcVar3;
  
  sVar2 = 0;
  do {
    pcVar3 = strCharSet;
    if (*string == L'\0') {
      return sVar2;
    }
    while (cVar1 = *pcVar3, cVar1 != L'\0') {
      pcVar3 = pcVar3 + 1;
      if (*string == cVar1) {
        return sVar2;
      }
    }
    sVar2 = sVar2 + 1;
    string = string + 1;
  } while( true );
}

Assistant:

size_t
__cdecl
PAL_wcscspn(const char16_t *string, const char16_t *strCharSet)
{
    const char16_t *temp;
    size_t count = 0;

    PERF_ENTRY(wcscspn);

    while(*string != 0)
    {
        for(temp = strCharSet; *temp != 0; temp++)
        {
            if (*string == *temp)
            {
                PERF_EXIT(wcscspn);
                return count;
            }
        }
        count++;
        string++;
    }
    PERF_EXIT(wcscspn);
    return count;
}